

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSlerp.cpp
# Opt level: O1

void anon_unknown.dwarf_e222a::compareQuats(Quatf *q1,Quatf *q2,float e)

{
  float fVar1;
  float fVar2;
  
  fVar1 = (q1->v).x;
  fVar2 = (q2->v).x;
  if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                 (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
    __assert_fail("equalWithAbsError (q1.v.x, q2.v.x, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testQuatSlerp.cpp"
                  ,0x1a,
                  "void (anonymous namespace)::compareQuats(const Quatf &, const Quatf &, float)");
  }
  fVar1 = (q1->v).y;
  fVar2 = (q2->v).y;
  if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                 (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
    __assert_fail("equalWithAbsError (q1.v.y, q2.v.y, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testQuatSlerp.cpp"
                  ,0x1b,
                  "void (anonymous namespace)::compareQuats(const Quatf &, const Quatf &, float)");
  }
  fVar1 = (q1->v).z;
  fVar2 = (q2->v).z;
  if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                 (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
    __assert_fail("equalWithAbsError (q1.v.z, q2.v.z, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testQuatSlerp.cpp"
                  ,0x1c,
                  "void (anonymous namespace)::compareQuats(const Quatf &, const Quatf &, float)");
  }
  fVar1 = q1->r;
  fVar2 = q2->r;
  if ((float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
             (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1)) <= e) {
    return;
  }
  __assert_fail("equalWithAbsError (q1.r, q2.r, e)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testQuatSlerp.cpp"
                ,0x1d,
                "void (anonymous namespace)::compareQuats(const Quatf &, const Quatf &, float)");
}

Assistant:

void
compareQuats (const Quatf& q1, const Quatf& q2, float e)
{
    assert (equalWithAbsError (q1.v.x, q2.v.x, e));
    assert (equalWithAbsError (q1.v.y, q2.v.y, e));
    assert (equalWithAbsError (q1.v.z, q2.v.z, e));
    assert (equalWithAbsError (q1.r, q2.r, e));
}